

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall ON_NurbsSurface::ChangeDimension(ON_NurbsSurface *this,int desired_dimension)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  double *pdVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  int iVar14;
  ulong uVar15;
  double *pdVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  int local_104;
  int local_100;
  long local_d8;
  double *local_d0;
  double *local_c8;
  
  if ((0 < desired_dimension) && (this->m_dim != desired_dimension)) {
    ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
    iVar2 = this->m_dim;
    if (desired_dimension < iVar2) {
      if ((this->m_is_rat != 0) && (iVar3 = this->m_cv_count[0], 0 < (long)iVar3)) {
        uVar4 = this->m_cv_count[1];
        iVar7 = this->m_cv_stride[0];
        iVar14 = this->m_cv_stride[1];
        pdVar6 = this->m_cv;
        lVar11 = 0;
        lVar19 = 0;
        pdVar16 = pdVar6;
        do {
          pdVar13 = pdVar16;
          uVar15 = (ulong)uVar4;
          lVar8 = lVar11;
          if (0 < (int)uVar4) {
            do {
              pdVar10 = (double *)0x0;
              if (-1 < lVar8) {
                pdVar10 = pdVar13;
              }
              if (pdVar6 == (double *)0x0) {
                pdVar10 = pdVar6;
              }
              pdVar10[(uint)desired_dimension] = pdVar10[iVar2];
              uVar15 = uVar15 - 1;
              pdVar13 = pdVar13 + iVar14;
              lVar8 = lVar8 + iVar14;
            } while (uVar15 != 0);
          }
          lVar19 = lVar19 + 1;
          pdVar16 = pdVar16 + iVar7;
          lVar11 = lVar11 + iVar7;
        } while (lVar19 != iVar3);
      }
    }
    else {
      iVar2 = this->m_cv_stride[0];
      iVar3 = this->m_cv_stride[1];
      iVar7 = (desired_dimension + 1) - (uint)(this->m_is_rat == 0);
      local_104 = iVar3;
      local_100 = iVar2;
      if (iVar3 < iVar7 && iVar2 < iVar7) {
        iVar14 = this->m_cv_count[0] * iVar7;
        local_104 = iVar14;
        local_100 = 1;
        if (iVar3 < iVar2) {
          local_104 = iVar7;
          local_100 = this->m_cv_count[1];
        }
        local_100 = local_100 * iVar7;
        ReserveCVCapacity(this,iVar14 * this->m_cv_count[1]);
      }
      lVar11 = (long)iVar2;
      lVar19 = (long)iVar3;
      if (iVar3 < iVar2) {
        iVar2 = this->m_cv_count[0];
        local_d8 = (long)iVar2;
        if (0 < local_d8) {
          uVar4 = this->m_cv_count[1];
          pdVar6 = this->m_cv;
          uVar5 = this->m_dim;
          uVar15 = (ulong)uVar5;
          lVar12 = (long)local_104;
          lVar17 = (long)local_100;
          lVar8 = (long)(int)uVar4 + -1;
          local_c8 = pdVar6 + uVar15 + lVar8 * lVar12 + (local_d8 + -1) * lVar17 + -1;
          local_d0 = pdVar6 + uVar15 + lVar8 * lVar19 + (local_d8 + -1) * lVar11 + -1;
          iVar3 = this->m_is_rat;
          iVar7 = 0;
          do {
            local_d8 = local_d8 + -1;
            if (0 < (int)uVar4) {
              iVar14 = this->m_dim;
              uVar18 = 0;
              lVar8 = (long)(int)uVar4;
              pdVar16 = local_c8;
              pdVar13 = local_d0;
              do {
                lVar8 = lVar8 + -1;
                if (iVar3 != 0) {
                  pdVar6[local_d8 * lVar17 + lVar8 * lVar12 + (ulong)(uint)desired_dimension] =
                       pdVar6[local_d8 * lVar11 + lVar8 * lVar19 + (long)iVar14];
                }
                if ((int)uVar5 < desired_dimension) {
                  memset(pdVar6 + (((ulong)(uint)desired_dimension +
                                   (long)(int)(((uVar4 - 1) * local_104 + (iVar2 + -1) * local_100)
                                              - (local_104 * (int)uVar18 + local_100 * iVar7)) + -1)
                                  - (ulong)(~uVar5 + desired_dimension)),0,
                         (ulong)(~uVar5 + desired_dimension) * 8 + 8);
                }
                if (0 < (int)uVar5) {
                  lVar9 = 0;
                  do {
                    pdVar16[lVar9] = pdVar13[lVar9];
                    lVar1 = uVar15 + lVar9;
                    lVar9 = lVar9 + -1;
                  } while (1 < lVar1);
                }
                uVar18 = uVar18 + 1;
                pdVar16 = pdVar16 + -lVar12;
                pdVar13 = pdVar13 + -lVar19;
              } while (uVar18 != uVar4);
            }
            iVar7 = iVar7 + 1;
            local_c8 = local_c8 + -lVar17;
            local_d0 = local_d0 + -lVar11;
          } while (iVar7 != iVar2);
        }
      }
      else {
        iVar2 = this->m_cv_count[1];
        local_d8 = (long)iVar2;
        if (0 < local_d8) {
          uVar4 = this->m_cv_count[0];
          pdVar6 = this->m_cv;
          uVar5 = this->m_dim;
          uVar15 = (ulong)uVar5;
          lVar12 = (long)local_100;
          lVar17 = (long)local_104;
          lVar8 = (long)(int)uVar4 + -1;
          local_c8 = pdVar6 + uVar15 + lVar8 * lVar12 + (local_d8 + -1) * lVar17 + -1;
          local_d0 = pdVar6 + uVar15 + lVar8 * lVar11 + (local_d8 + -1) * lVar19 + -1;
          iVar3 = this->m_is_rat;
          iVar7 = 0;
          do {
            local_d8 = local_d8 + -1;
            if (0 < (int)uVar4) {
              iVar14 = this->m_dim;
              uVar18 = 0;
              lVar8 = (long)(int)uVar4;
              pdVar16 = local_c8;
              pdVar13 = local_d0;
              do {
                lVar8 = lVar8 + -1;
                if (iVar3 != 0) {
                  pdVar6[local_d8 * lVar17 + lVar8 * lVar12 + (ulong)(uint)desired_dimension] =
                       pdVar6[local_d8 * lVar19 + lVar8 * lVar11 + (long)iVar14];
                }
                if ((int)uVar5 < desired_dimension) {
                  memset(pdVar6 + (((ulong)(uint)desired_dimension +
                                   (long)(int)(((uVar4 - 1) * local_100 + (iVar2 + -1) * local_104)
                                              - (local_100 * (int)uVar18 + local_104 * iVar7)) + -1)
                                  - (ulong)(~uVar5 + desired_dimension)),0,
                         (ulong)(~uVar5 + desired_dimension) * 8 + 8);
                }
                if (0 < (int)uVar5) {
                  lVar9 = 0;
                  do {
                    pdVar16[lVar9] = pdVar13[lVar9];
                    lVar1 = uVar15 + lVar9;
                    lVar9 = lVar9 + -1;
                  } while (1 < lVar1);
                }
                uVar18 = uVar18 + 1;
                pdVar16 = pdVar16 + -lVar12;
                pdVar13 = pdVar13 + -lVar11;
              } while (uVar18 != uVar4);
            }
            iVar7 = iVar7 + 1;
            local_c8 = local_c8 + -lVar17;
            local_d0 = local_d0 + -lVar19;
          } while (iVar7 != iVar2);
        }
      }
      this->m_cv_stride[0] = local_100;
      this->m_cv_stride[1] = local_104;
    }
    this->m_dim = desired_dimension;
  }
  return 0 < desired_dimension;
}

Assistant:

bool ON_NurbsSurface::ChangeDimension(
          int desired_dimension  //  desired_dimension
          )
{
  bool rc = false;
  int i, j, k;
  if ( desired_dimension < 1 )
    return false;
  if ( desired_dimension == m_dim )
    return true;

  DestroySurfaceTree();

  if ( desired_dimension < m_dim ) 
  {
    if ( m_is_rat ) {
      double* cv;
      for ( i = 0; i < m_cv_count[0]; i++ ) 
      {
        for ( j = 0; j < m_cv_count[1]; j++ ) 
        {
          cv = CV(i,j);
          cv[desired_dimension] = cv[m_dim];
        }
      }
    }
    m_dim = desired_dimension;
    rc = true;
  }
  else 
  {
    const double* old_cv;
    double* new_cv;
    //const int old_cv_size = m_is_rat ? (m_dim + 1) : m_dim;
    const int old_stride0 = m_cv_stride[0];
    const int old_stride1 = m_cv_stride[1];
    const int cv_size = m_is_rat ? (desired_dimension + 1) : desired_dimension;
    int new_stride0 = old_stride0;
    int new_stride1 = old_stride1;
    if ( cv_size > old_stride0 && cv_size > old_stride1 )
    {      
      new_stride0 = (old_stride0 <= old_stride1) ? cv_size : (cv_size*m_cv_count[1]);
      new_stride1 = (old_stride0 <= old_stride1) ? (cv_size*m_cv_count[0]) : cv_size;
      ReserveCVCapacity(cv_size*m_cv_count[0]*m_cv_count[1]);
    }

    if ( old_stride0 <= old_stride1 )
    {
      for ( j = m_cv_count[1]-1; j >= 0; j-- )
      {
        for ( i = m_cv_count[0]-1; i >= 0; i-- )
        {
          old_cv = m_cv + (old_stride0*i + old_stride1*j);
          new_cv = m_cv + (new_stride0*i + new_stride1*j);
          if ( m_is_rat )
          {
            new_cv[desired_dimension] = old_cv[m_dim];
          }
          for ( k = desired_dimension-1; k >= m_dim; k-- )
          {
            new_cv[k] = 0.0;
          }
          for ( k = m_dim-1; k >= 0; k-- )
          {
            new_cv[k] = old_cv[k];
          }
        }
      }
    }
    else
    {
      for ( i = m_cv_count[0]-1; i >= 0; i-- )
      {
        for ( j = m_cv_count[1]-1; j >= 0; j-- )
        {
          old_cv = m_cv + (old_stride0*i + old_stride1*j);
          new_cv = m_cv + (new_stride0*i + new_stride1*j);
          if ( m_is_rat )
          {
            new_cv[desired_dimension] = old_cv[m_dim];
          }
          for ( k = desired_dimension-1; k >= m_dim; k-- )
          {
            new_cv[k] = 0.0;
          }
          for ( k = m_dim-1; k >= 0; k-- )
          {
            new_cv[k] = old_cv[k];
          }
        }
      }
    }
    m_cv_stride[0] = new_stride0;
    m_cv_stride[1] = new_stride1;
    m_dim = desired_dimension;
    rc = true;
  }
  return rc;
}